

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::date_format<wchar_t>::date_format
          (date_format<wchar_t> *this,
          unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *fmt,
          string *codepage)

{
  string asStack_38 [32];
  
  (this->super_formatter<wchar_t>).super_base_formatter._vptr_base_formatter =
       (_func_int **)&PTR__date_format_001db168;
  std::__cxx11::string::string(asStack_38,(string *)codepage);
  (this->cvt_).mode_ = cvt_skip;
  std::__cxx11::string::~string(asStack_38);
  (this->aicu_fmt_)._M_t.
  super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
  super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl =
       (fmt->_M_t).
       super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
       super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
       super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl;
  (fmt->_M_t).super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>.
  _M_t.super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl = (DateFormat *)0x0;
  this->icu_fmt_ =
       (this->aicu_fmt_)._M_t.
       super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
       super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
       super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl;
  return;
}

Assistant:

date_format(std::unique_ptr<icu::DateFormat> fmt,std::string codepage) :
                cvt_(codepage),
                aicu_fmt_(std::move(fmt))
            {
                icu_fmt_ = aicu_fmt_.get();
            }